

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O3

XMLError __thiscall tinyxml2::XMLDocument::Parse(XMLDocument *this,char *p,size_t len)

{
  XMLError XVar1;
  char *__dest;
  
  Clear(this);
  if ((p == (char *)0x0 || len == 0) || (*p == '\0')) {
    this->_errorID = XML_ERROR_EMPTY_DOCUMENT;
    this->_errorStr1 = (char *)0x0;
    this->_errorStr2 = (char *)0x0;
    XVar1 = XML_ERROR_EMPTY_DOCUMENT;
  }
  else {
    if (len == 0xffffffffffffffff) {
      len = strlen(p);
    }
    __dest = (char *)operator_new__(len + 1);
    this->_charBuffer = __dest;
    memcpy(__dest,p,len);
    __dest[len] = '\0';
    Parse(this);
    if (this->_errorID == XML_NO_ERROR) {
      XVar1 = XML_NO_ERROR;
    }
    else {
      XMLNode::DeleteChildren(&this->super_XMLNode);
      MemPoolT<104>::Clear(&this->_elementPool);
      MemPoolT<72>::Clear(&this->_attributePool);
      MemPoolT<96>::Clear(&this->_textPool);
      MemPoolT<88>::Clear(&this->_commentPool);
      XVar1 = this->_errorID;
    }
  }
  return XVar1;
}

Assistant:

XMLError XMLDocument::Parse( const char* p, size_t len )
{
    Clear();

    if ( len == 0 || !p || !*p ) {
        SetError( XML_ERROR_EMPTY_DOCUMENT, 0, 0 );
        return _errorID;
    }
    if ( len == (size_t)(-1) ) {
        len = strlen( p );
    }
    _charBuffer = new char[ len+1 ];
    memcpy( _charBuffer, p, len );
    _charBuffer[len] = 0;

    Parse();
    if ( Error() ) {
        // clean up now essentially dangling memory.
        // and the parse fail can put objects in the
        // pools that are dead and inaccessible.
        DeleteChildren();
        _elementPool.Clear();
        _attributePool.Clear();
        _textPool.Clear();
        _commentPool.Clear();
    }
    return _errorID;
}